

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  undefined1 *puVar1;
  ushort uVar2;
  char cVar3;
  size_t sVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  bool bVar15;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar4 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar4;
  }
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    puVar1 = (undefined1 *)((long)dst + maxDstSize);
    uVar2 = *(ushort *)((long)DTable + 2);
    if (cSrcSize < 8) {
      uVar12 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar12 = uVar12 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar5 == 0) {
        return 0xffffffffffffffec;
      }
      uVar11 = (ulong)(LZCOUNT((uint)bVar5) + (int)cSrcSize * -8 + 0x29);
      puVar14 = (ulong *)cSrc;
      if (3 < (long)maxDstSize) {
        uVar10 = 0;
        goto LAB_001bbd83;
      }
    }
    else {
      bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar5 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      uVar10 = cSrcSize - 8;
      uVar12 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      uVar7 = (LZCOUNT((uint)bVar5) ^ 0xffffffe0U) + 9;
      uVar11 = (ulong)uVar7;
      puVar14 = (ulong *)((long)cSrc + uVar10);
      if (3 < (long)maxDstSize) {
LAB_001bbd83:
        uVar7 = -(uint)uVar2 & 0x3f;
        do {
          if ((long)uVar10 < 8) {
            if (uVar10 == 0) goto LAB_001bbe9a;
            uVar6 = (uint)(uVar11 >> 3);
            bVar15 = cSrc <= (void *)((long)puVar14 - (uVar11 >> 3));
            if (!bVar15) {
              uVar6 = (uint)uVar10;
            }
            uVar9 = (uint)uVar11 + uVar6 * -8;
          }
          else {
            uVar6 = (uint)(uVar11 >> 3);
            uVar9 = (uint)uVar11 & 7;
            bVar15 = true;
          }
          uVar11 = (ulong)uVar9;
          uVar10 = uVar10 - uVar6;
          puVar14 = (ulong *)((long)cSrc + uVar10);
          uVar12 = *(ulong *)((long)cSrc + uVar10);
          if ((puVar1 + -3 <= dst) || (!bVar15)) goto LAB_001bbe9a;
          uVar11 = (uVar12 << (uVar11 & 0x3f)) >> uVar7;
          uVar9 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uVar9;
          *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
          uVar11 = (uVar12 << ((ulong)uVar9 & 0x3f)) >> uVar7;
          uVar9 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uVar9;
          *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
          uVar11 = (uVar12 << ((ulong)uVar9 & 0x3f)) >> uVar7;
          uVar9 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uVar9;
          *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
          uVar13 = (uVar12 << ((ulong)uVar9 & 0x3f)) >> uVar7;
          uVar9 = *(byte *)((long)DTable + uVar13 * 2 + 4) + uVar9;
          uVar11 = (ulong)uVar9;
          *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
          dst = (void *)((long)dst + 4);
          if (0x40 < uVar9) goto LAB_001bbe9a;
        } while( true );
      }
      if ((long)cSrcSize < 0x10) {
        if (uVar10 == 0) goto LAB_001bbe9a;
        uVar10 = uVar10 & 0xffffffff;
        if (cSrc <= (void *)((long)puVar14 - (ulong)(uVar7 >> 3))) {
          uVar10 = (ulong)(uVar7 >> 3);
        }
        uVar7 = uVar7 + (int)uVar10 * -8;
      }
      else {
        uVar10 = (ulong)(uVar7 >> 3);
        uVar7 = uVar7 & 7;
      }
      uVar11 = (ulong)uVar7;
      uVar12 = *(ulong *)((long)puVar14 - uVar10);
      puVar14 = (ulong *)((long)puVar14 - uVar10);
    }
LAB_001bbe9a:
    if (dst < puVar1) {
      do {
        uVar10 = (uVar12 << (uVar11 & 0x3f)) >> (-(uint)uVar2 & 0x3f);
        uVar7 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + (int)uVar11;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
        dst = (void *)((long)dst + 1);
        uVar11 = (ulong)uVar7;
      } while (dst < puVar1);
    }
    else {
      uVar7 = (uint)uVar11;
    }
    if (uVar7 != 0x40) {
      maxDstSize = 0xffffffffffffffec;
    }
    if (puVar14 != (ulong *)cSrc) {
      maxDstSize = 0xffffffffffffffec;
    }
    return maxDstSize;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  cVar3 = (char)*(undefined2 *)((long)DTable + 2);
  if (cSrcSize < 8) {
    uVar12 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar12 = uVar12 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar12 = uVar12 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar12 = uVar12 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar5 == 0) {
      return 0xffffffffffffffec;
    }
    uVar7 = 0x1f;
    if (bVar5 != 0) {
      for (; bVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    puVar14 = (ulong *)cSrc;
    if (3 < (long)maxDstSize) {
      uVar11 = 0;
      goto LAB_00177af4;
    }
  }
  else {
    bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar5 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar11 = cSrcSize - 8;
    puVar14 = (ulong *)((long)cSrc + (cSrcSize - 8));
    uVar12 = *puVar14;
    uVar7 = 0x1f;
    if (bVar5 != 0) {
      for (; bVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = ~uVar7 + 9;
    if (3 < (long)maxDstSize) {
LAB_00177af4:
      bVar5 = -cVar3 & 0x3f;
      do {
        if ((long)uVar11 < 8) {
          if (uVar11 == 0) goto LAB_00177c17;
          uVar6 = uVar7 >> 3;
          bVar15 = cSrc <= (void *)((long)puVar14 - (ulong)uVar6);
          if (!bVar15) {
            uVar6 = (uint)uVar11;
          }
          uVar7 = uVar7 + uVar6 * -8;
        }
        else {
          uVar6 = uVar7 >> 3;
          uVar7 = uVar7 & 7;
          bVar15 = true;
        }
        uVar11 = uVar11 - uVar6;
        puVar14 = (ulong *)((long)cSrc + uVar11);
        uVar12 = *(ulong *)((long)cSrc + uVar11);
        if ((puVar1 + -3 <= dst) || (!bVar15)) goto LAB_00177c17;
        uVar10 = (uVar12 << ((byte)uVar7 & 0x3f)) >> bVar5;
        iVar8 = *(byte *)((long)DTable + uVar10 * 2 + 4) + uVar7;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
        uVar10 = (uVar12 << ((byte)iVar8 & 0x3f)) >> bVar5;
        iVar8 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar8;
        uVar13 = (uVar12 << ((byte)iVar8 & 0x3f)) >> bVar5;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
        iVar8 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar8;
        uVar10 = (uVar12 << ((byte)iVar8 & 0x3f)) >> bVar5;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar7 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar8;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
        dst = (void *)((long)dst + 4);
        if (0x40 < uVar7) goto LAB_00177c17;
      } while( true );
    }
    if ((long)cSrcSize < 0x10) {
      if (uVar11 == 0) goto LAB_00177c17;
      uVar11 = uVar11 & 0xffffffff;
      if (cSrc <= (void *)((long)puVar14 - (ulong)(uVar7 >> 3))) {
        uVar11 = (ulong)(uVar7 >> 3);
      }
      uVar7 = uVar7 + (int)uVar11 * -8;
    }
    else {
      uVar11 = (ulong)(uVar7 >> 3);
      uVar7 = uVar7 & 7;
    }
    uVar12 = *(ulong *)((long)puVar14 - uVar11);
    puVar14 = (ulong *)((long)puVar14 - uVar11);
  }
LAB_00177c17:
  if (dst < puVar1) {
    do {
      uVar11 = (uVar12 << ((byte)uVar7 & 0x3f)) >> (-cVar3 & 0x3fU);
      uVar7 = uVar7 + *(byte *)((long)DTable + uVar11 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar1);
  }
  if (uVar7 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar14 != (ulong *)cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}